

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_IteratorNext(JSContext *ctx,JSValue enum_obj,JSValue method,int argc,JSValue *argv,
                       BOOL *pdone)

{
  int iVar1;
  ulong uVar2;
  undefined4 in_register_0000008c;
  int *piVar3;
  JSValue obj;
  JSValue JVar4;
  int done;
  
  piVar3 = (int *)CONCAT44(in_register_0000008c,argc);
  obj = JS_IteratorNext2(ctx,enum_obj,method,0,(JSValue *)0x0,&done);
  if ((int)obj.tag != 6) {
    if (done != 2) {
      *piVar3 = done;
      uVar2 = (ulong)obj.u.ptr & 0xffffffff00000000;
      goto LAB_00133309;
    }
    JVar4 = JS_GetPropertyInternal(ctx,obj,0x69,obj,0);
    if ((int)JVar4.tag != 6) {
      iVar1 = JS_ToBoolFree(ctx,JVar4);
      *piVar3 = iVar1;
      if (iVar1 == 0) {
        JVar4 = JS_GetPropertyInternal(ctx,obj,0x40,obj,0);
        uVar2 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
      }
      else {
        JVar4 = (JSValue)(ZEXT816(3) << 0x40);
        uVar2 = 0;
      }
      JS_FreeValue(ctx,obj);
      obj = JVar4;
      goto LAB_00133309;
    }
  }
  JS_FreeValue(ctx,obj);
  *piVar3 = 0;
  uVar2 = 0;
  obj = (JSValue)(ZEXT816(6) << 0x40);
LAB_00133309:
  JVar4.u.ptr = (void *)((ulong)obj.u.ptr & 0xffffffff | uVar2);
  JVar4.tag = obj.tag;
  return JVar4;
}

Assistant:

static JSValue JS_IteratorNext(JSContext *ctx, JSValueConst enum_obj,
                               JSValueConst method,
                               int argc, JSValueConst *argv, BOOL *pdone)
{
    JSValue obj, value, done_val;
    int done;

    obj = JS_IteratorNext2(ctx, enum_obj, method, argc, argv, &done);
    if (JS_IsException(obj))
        goto fail;
    if (done != 2) {
        *pdone = done;
        return obj;
    } else {
        done_val = JS_GetProperty(ctx, obj, JS_ATOM_done);
        if (JS_IsException(done_val))
            goto fail;
        *pdone = JS_ToBoolFree(ctx, done_val);
        value = JS_UNDEFINED;
        if (!*pdone) {
            value = JS_GetProperty(ctx, obj, JS_ATOM_value);
        }
        JS_FreeValue(ctx, obj);
        return value;
    }
 fail:
    JS_FreeValue(ctx, obj);
    *pdone = FALSE;
    return JS_EXCEPTION;
}